

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void searchtest(void)

{
  search234_state ss_00;
  char *pcVar1;
  ulong uVar2;
  search234_state ss;
  char *expected [60];
  char directionbuf [600];
  search234_state local_470;
  char *local_448 [60];
  char local_268 [600];
  
  if (verbose != 0) {
    printf("beginning searchtest:");
  }
  uVar2 = 0;
  pcVar1 = (char *)index234(tree,0);
  if (pcVar1 != (char *)0x0) {
    uVar2 = 0;
    do {
      local_448[uVar2] = pcVar1;
      if (verbose != 0) {
        printf(" %d=%s",uVar2 & 0xffffffff,pcVar1);
      }
      uVar2 = uVar2 + 1;
      pcVar1 = (char *)index234(tree,(int)uVar2);
    } while (pcVar1 != (char *)0x0);
  }
  if (verbose != 0) {
    printf(" count=%d\n");
  }
  local_470._node = tree->root;
  local_470._last = -1;
  local_470._base = 0;
  search234_step(&local_470,0);
  ss_00._last = local_470._last;
  ss_00._hi = local_470._hi;
  ss_00._28_4_ = local_470._28_4_;
  ss_00._base = local_470._base;
  ss_00.index = local_470.index;
  ss_00._lo = local_470._lo;
  ss_00.element = local_470.element;
  ss_00._node = local_470._node;
  searchtest_recurse(ss_00,0,(int)uVar2,local_448,local_268,local_268);
  return;
}

Assistant:

void searchtest(void)
{
    char *expected[NSTR], *p;
    char directionbuf[NSTR * 10];
    int n;
    search234_state ss;

    if (verbose)
        printf("beginning searchtest:");
    for (n = 0; (p = index234(tree, n)) != NULL; n++) {
        expected[n] = p;
        if (verbose)
            printf(" %d=%s", n, p);
    }
    if (verbose)
        printf(" count=%d\n", n);

    search234_start(&ss, tree);
    searchtest_recurse(ss, 0, n, expected, directionbuf, directionbuf);
}